

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::FinalizeChunkProcess(StringValueScanner *this)

{
  StringValueResult *result;
  idx_t *piVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  LineError *this_01;
  int64_t *piVar2;
  CSVState CVar3;
  idx_t iVar4;
  pointer pCVar5;
  ulong uVar6;
  ValidityMask *pVVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  byte bVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  bool bVar11;
  CurrentError *error_2;
  CSVFileScan *pCVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  pointer pVVar14;
  CSVBufferHandle *pCVar15;
  pointer pCVar16;
  CSVStateMachine *pCVar17;
  ulong uVar18;
  CurrentError *error;
  pointer pCVar19;
  pointer pVVar20;
  pointer pCVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  long lVar23;
  vector<duckdb::CurrentError,_true> *__range2;
  CSVErrorType type;
  _Head_base<0UL,_unsigned_long_*,_false> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Head_base<0UL,_unsigned_long_*,_false> local_38;
  
  if (((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) ||
     ((this->super_BaseScanner).iterator.done == true)) {
    if ((this->super_BaseScanner).sniffing != false) {
      return;
    }
    if ((this->super_BaseScanner).csv_file_scan.internal.
        super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return;
    }
    iVar4 = (this->super_BaseScanner).bytes_read;
    pCVar12 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                        (&(this->super_BaseScanner).csv_file_scan);
    LOCK();
    (pCVar12->bytes_read).super___atomic_base<unsigned_long>._M_i =
         (pCVar12->bytes_read).super___atomic_base<unsigned_long>._M_i + iVar4;
    UNLOCK();
    (this->super_BaseScanner).bytes_read = 0;
    return;
  }
  result = &this->result;
  if ((this->super_BaseScanner).iterator.is_set == false) {
    while ((bVar11 = BaseScanner::FinishedFile(&this->super_BaseScanner), !bVar11 &&
           ((ulong)(this->result).number_of_rows < (this->result).super_ScannerResult.result_size)))
    {
      MoveToNextBuffer(this);
      if ((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) {
        return;
      }
      if ((this->super_BaseScanner).cur_buffer_handle.internal.
          super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        BaseScanner::Process<duckdb::StringValueResult>(&this->super_BaseScanner,result);
      }
    }
    bVar11 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    (this->super_BaseScanner).iterator.done = bVar11;
    lVar23 = (this->result).number_of_rows;
    if ((lVar23 < 0x800 & (this->result).null_padding) != 1) {
      return;
    }
    uVar18 = (this->result).chunk_col_id;
    if (uVar18 == 0) {
      return;
    }
    pVVar14 = (this->result).parse_chunk.data.
              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar20 = *(pointer *)
               ((long)&(this->result).parse_chunk.data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data + 8);
    if (uVar18 < (ulong)(((long)pVVar20 - (long)pVVar14 >> 3) * 0x4ec4ec4ec4ec4ec5)) {
      do {
        (this->result).chunk_col_id = uVar18 + 1;
        uVar6 = (this->result).number_of_rows;
        pVVar7 = (this->result).validity_mask.
                 super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                 super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18];
        _Var22._M_head_impl = (pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var22._M_head_impl == (unsigned_long *)0x0) {
          local_38._M_head_impl =
               (unsigned_long *)(pVVar7->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,(unsigned_long *)&local_38);
          p_Var9 = p_Stack_40;
          _Var22._M_head_impl = local_48._M_head_impl;
          local_48._M_head_impl = (unsigned_long *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_02 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))
                    ->_M_pi;
          (pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var22._M_head_impl;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->_M_pi =
               p_Var9;
          if ((this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02),
             p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_data);
          _Var22._M_head_impl =
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
          pVVar14 = (this->result).parse_chunk.data.
                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar20 = *(pointer *)
                     ((long)&(this->result).parse_chunk.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data + 8);
        }
        bVar8 = (byte)uVar6 & 0x3f;
        _Var22._M_head_impl[uVar6 >> 6] =
             _Var22._M_head_impl[uVar6 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        piVar1 = &(this->result).cur_col_id;
        *piVar1 = *piVar1 + 1;
        uVar18 = (this->result).chunk_col_id;
      } while (uVar18 < (ulong)(((long)pVVar20 - (long)pVVar14 >> 3) * 0x4ec4ec4ec4ec4ec5));
      lVar23 = (this->result).number_of_rows;
    }
    (this->result).number_of_rows = lVar23 + 1;
    return;
  }
  pCVar16 = (this->result).current_errors.current_errors.
            super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
            super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar5 = *(pointer *)
            ((long)&(this->result).current_errors.current_errors.
                    super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    _M_impl.super__Vector_impl_data + 8);
  pCVar21 = pCVar16;
  if (pCVar16 != pCVar5) {
    do {
      if (pCVar21->type == UNTERMINATED_QUOTES) goto LAB_00d0aa55;
      pCVar21 = pCVar21 + 1;
      pCVar19 = pCVar16;
    } while (pCVar21 != pCVar5);
    do {
      if (pCVar19->type == INVALID_STATE) goto LAB_00d0aa55;
      pCVar19 = pCVar19 + 1;
    } while (pCVar19 != pCVar5);
  }
  (this->super_BaseScanner).iterator.done = true;
  bVar11 = false;
  goto LAB_00d0abfe;
LAB_00d0ac97:
  pCVar16 = pCVar16 + 1;
  if (pCVar16 == pCVar5) goto LAB_00d0acb2;
  goto LAB_00d0aca0;
  while (pCVar16 = pCVar16 + 1, pCVar16 != pCVar5) {
LAB_00d0aa55:
    if (pCVar16->type == UNTERMINATED_QUOTES) {
      local_48._M_head_impl._0_1_ = 4;
      goto LAB_00d0abfb;
    }
  }
  local_48._M_head_impl._0_1_ = 9;
LAB_00d0abfb:
  bVar11 = true;
LAB_00d0abfe:
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    bVar10 = MoveToNextBuffer(this);
    if ((this->super_BaseScanner).cur_buffer_handle.internal.
        super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      this_00 = &(this->super_BaseScanner).cur_buffer_handle;
      if (!bVar10 || (this->result).cur_col_id != 0 && bVar10) {
        ProcessExtraRow(this);
      }
      pCVar15 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
      if ((pCVar15->is_last_buffer == true) &&
         (uVar18 = (this->super_BaseScanner).iterator.pos.buffer_pos,
         pCVar15 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
         pCVar15->actual_size <= uVar18)) {
        MoveToNextBuffer(this);
      }
    }
    this_01 = &(this->result).current_errors;
    pCVar16 = (this->result).current_errors.current_errors.
              super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
              super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar5 = *(pointer *)
              ((long)&(this->result).current_errors.current_errors.
                      super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                      super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>
                      ._M_impl.super__Vector_impl_data + 8);
    pCVar21 = pCVar16;
    if (pCVar16 != pCVar5) {
      do {
        if (pCVar21->type == UNTERMINATED_QUOTES) {
          local_48._M_head_impl._0_1_ = 4;
          goto LAB_00d0acaf;
        }
        pCVar21 = pCVar21 + 1;
      } while (pCVar21 != pCVar5);
LAB_00d0aca0:
      if (pCVar16->type != INVALID_STATE) goto LAB_00d0ac97;
      local_48._M_head_impl._0_1_ = 9;
LAB_00d0acaf:
      bVar11 = true;
    }
LAB_00d0acb2:
    bVar10 = LineError::HandleErrors(this_01,result);
    if (bVar10) {
      piVar2 = &(this->result).number_of_rows;
      *piVar2 = *piVar2 + 1;
    }
    CVar3 = (this->super_BaseScanner).states.states[1];
    if ((!bVar11 && (CVar3 == QUOTED_NEW_LINE || CVar3 == QUOTED)) &&
       (pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                            (&(this->super_BaseScanner).state_machine),
       (pCVar17->dialect_options).state_machine_options.strict_mode.value == true)) {
      local_48._M_head_impl._0_1_ = 4;
      LineError::Insert(this_01,(CSVErrorType *)&local_48,&(this->result).cur_col_id,
                        &(this->result).chunk_col_id,
                        &(this->result).super_ScannerResult.last_position,0);
      bVar11 = LineError::HandleErrors(this_01,result);
      if (bVar11) {
        piVar2 = &(this->result).number_of_rows;
        *piVar2 = *piVar2 + 1;
      }
    }
    if (((this->super_BaseScanner).iterator.done == false) &&
       (((this->super_BaseScanner).iterator.boundary.end_pos <=
         (this->super_BaseScanner).iterator.pos.buffer_pos ||
        (bVar11 = BaseScanner::FinishedFile(&this->super_BaseScanner), bVar11)))) {
      (this->super_BaseScanner).iterator.done = true;
    }
  }
  return;
}

Assistant:

void StringValueScanner::FinalizeChunkProcess() {
	if (static_cast<idx_t>(result.number_of_rows) >= result.result_size || iterator.done) {
		// We are done
		if (!sniffing) {
			if (csv_file_scan) {
				csv_file_scan->bytes_read += bytes_read;
				bytes_read = 0;
			}
		}
		return;
	}
	// If we are not done we have two options.
	// 1) If a boundary is set.
	if (iterator.IsBoundarySet()) {
		bool found_error = false;
		CSVErrorType type;
		if (!result.current_errors.HasErrorType(UNTERMINATED_QUOTES) &&
		    !result.current_errors.HasErrorType(INVALID_STATE)) {
			iterator.done = true;
		} else {
			found_error = true;
			if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
				type = UNTERMINATED_QUOTES;
			} else {
				type = INVALID_STATE;
			}
		}
		// We read until the next line or until we have nothing else to read.
		// Move to next buffer
		if (!cur_buffer_handle) {
			return;
		}
		bool moved = MoveToNextBuffer();
		if (cur_buffer_handle) {
			if (moved && result.cur_col_id > 0) {
				ProcessExtraRow();
			} else if (!moved) {
				ProcessExtraRow();
			}
			if (cur_buffer_handle->is_last_buffer && iterator.pos.buffer_pos >= cur_buffer_handle->actual_size) {
				MoveToNextBuffer();
			}
		}
		if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
			found_error = true;
			type = UNTERMINATED_QUOTES;
		} else if (result.current_errors.HasErrorType(INVALID_STATE)) {
			found_error = true;
			type = INVALID_STATE;
		}
		if (result.current_errors.HandleErrors(result)) {
			result.number_of_rows++;
		}
		if (states.IsQuotedCurrent() && !found_error &&
		    state_machine->dialect_options.state_machine_options.strict_mode.GetValue()) {
			type = UNTERMINATED_QUOTES;
			// If we finish the execution of a buffer, and we end in a quoted state, it means we have unterminated
			// quotes
			result.current_errors.Insert(type, result.cur_col_id, result.chunk_col_id, result.last_position);
			if (result.current_errors.HandleErrors(result)) {
				result.number_of_rows++;
			}
		}
		if (!iterator.done) {
			if (iterator.pos.buffer_pos >= iterator.GetEndPos() || iterator.pos.buffer_idx > iterator.GetBufferIdx() ||
			    FinishedFile()) {
				iterator.done = true;
			}
		}
	} else {
		// 2) If a boundary is not set
		// We read until the chunk is complete, or we have nothing else to read.
		while (!FinishedFile() && static_cast<idx_t>(result.number_of_rows) < result.result_size) {
			MoveToNextBuffer();
			if (static_cast<idx_t>(result.number_of_rows) >= result.result_size) {
				return;
			}
			if (cur_buffer_handle) {
				Process(result);
			}
		}
		iterator.done = FinishedFile();
		if (result.null_padding && result.number_of_rows < STANDARD_VECTOR_SIZE && result.chunk_col_id > 0) {
			while (result.chunk_col_id < result.parse_chunk.ColumnCount()) {
				result.validity_mask[result.chunk_col_id++]->SetInvalid(static_cast<idx_t>(result.number_of_rows));
				result.cur_col_id++;
			}
			result.number_of_rows++;
		}
	}
}